

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

OggOpusFile * op_vtest_url(char *_url,int *_error,__va_list_tag *_ap)

{
  void *_stream;
  void *source;
  OpusServerInfo *pinfo;
  OpusServerInfo info;
  OggOpusFile *of;
  OpusFileCallbacks cb;
  __va_list_tag *_ap_local;
  int *_error_local;
  char *_url_local;
  
  cb.close = (op_close_func)_ap;
  _stream = op_url_stream_vcreate_impl
                      ((OpusFileCallbacks *)&of,_url,(OpusServerInfo *)&pinfo,
                       (OpusServerInfo **)&source,_ap);
  if (_stream == (void *)0x0) {
    if (_error != (int *)0x0) {
      *_error = -0x81;
    }
    _url_local = (char *)0x0;
  }
  else {
    info._56_8_ = op_test_callbacks(_stream,(OpusFileCallbacks *)&of,(uchar *)0x0,0,_error);
    if ((OggOpusFile *)info._56_8_ == (OggOpusFile *)0x0) {
      if (source != (void *)0x0) {
        opus_server_info_clear((OpusServerInfo *)&pinfo);
      }
      (*cb.tell)(_stream);
    }
    else if (source != (void *)0x0) {
      memcpy(source,&pinfo,0x40);
    }
    _url_local = (char *)info._56_8_;
  }
  return (OggOpusFile *)_url_local;
}

Assistant:

OggOpusFile *op_vtest_url(const char *_url,int *_error,va_list _ap){
  OpusFileCallbacks  cb;
  OggOpusFile       *of;
  OpusServerInfo     info;
  OpusServerInfo    *pinfo;
  void              *source;
  source=op_url_stream_vcreate_impl(&cb,_url,&info,&pinfo,_ap);
  if(OP_UNLIKELY(source==NULL)){
    OP_ASSERT(pinfo==NULL);
    if(_error!=NULL)*_error=OP_EFAULT;
    return NULL;
  }
  of=op_test_callbacks(source,&cb,NULL,0,_error);
  if(OP_UNLIKELY(of==NULL)){
    if(pinfo!=NULL)opus_server_info_clear(&info);
    (*cb.close)(source);
  }
  else if(pinfo!=NULL)*pinfo=*&info;
  return of;
}